

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

char * Pa_GetErrorText(PaError errorCode)

{
  char *pcVar1;
  
  switch(errorCode) {
  case -10000:
    return "PortAudio not initialized";
  case -9999:
    return "Unanticipated host error";
  case -0x270e:
    return "Invalid number of channels";
  case -0x270d:
    return "Invalid sample rate";
  case -0x270c:
    return "Invalid device";
  case -0x270b:
    return "Invalid flag";
  case -0x270a:
    return "Sample format not supported";
  case -0x2709:
    return "Illegal combination of I/O devices";
  case -0x2708:
    return "Insufficient memory";
  case -0x2707:
    return "Buffer too big";
  case -0x2706:
    return "Buffer too small";
  case -0x2705:
    return "No callback routine specified";
  case -0x2704:
    return "Invalid stream pointer";
  case -0x2703:
    return "Wait timed out";
  case -0x2702:
    return "Internal PortAudio error";
  case -0x2701:
    return "Device unavailable";
  case -0x2700:
    return "Incompatible host API specific stream info";
  case -0x26ff:
    return "Stream is stopped";
  case -0x26fe:
    return "Stream is not stopped";
  case -0x26fd:
    return "Input overflowed";
  case -0x26fc:
    return "Output underflowed";
  case -0x26fb:
    return "Host API not found";
  case -0x26fa:
    return "Invalid host API";
  case -0x26f9:
    return "Can\'t read from a callback stream";
  case -0x26f8:
    return "Can\'t write to a callback stream";
  case -0x26f7:
    return "Can\'t read from an output only stream";
  case -0x26f6:
    return "Can\'t write to an input only stream";
  case -0x26f5:
    return "Incompatible stream host API";
  case -0x26f4:
    return "Bad buffer pointer";
  }
  if (errorCode != 0) {
    pcVar1 = "Invalid error code";
    if (0 < errorCode) {
      pcVar1 = "Invalid error code (value greater than zero)";
    }
    return pcVar1;
  }
  return "Success";
}

Assistant:

const char *Pa_GetErrorText( PaError errorCode )
{
    const char *result;

    switch( errorCode )
    {
    case paNoError:                  result = "Success"; break;
    case paNotInitialized:           result = "PortAudio not initialized"; break;
    /** @todo could catenate the last host error text to result in the case of paUnanticipatedHostError. see: http://www.portaudio.com/trac/ticket/114 */
    case paUnanticipatedHostError:   result = "Unanticipated host error"; break;
    case paInvalidChannelCount:      result = "Invalid number of channels"; break;
    case paInvalidSampleRate:        result = "Invalid sample rate"; break;
    case paInvalidDevice:            result = "Invalid device"; break;
    case paInvalidFlag:              result = "Invalid flag"; break;
    case paSampleFormatNotSupported: result = "Sample format not supported"; break;
    case paBadIODeviceCombination:   result = "Illegal combination of I/O devices"; break;
    case paInsufficientMemory:       result = "Insufficient memory"; break;
    case paBufferTooBig:             result = "Buffer too big"; break;
    case paBufferTooSmall:           result = "Buffer too small"; break;
    case paNullCallback:             result = "No callback routine specified"; break;
    case paBadStreamPtr:             result = "Invalid stream pointer"; break;
    case paTimedOut:                 result = "Wait timed out"; break;
    case paInternalError:            result = "Internal PortAudio error"; break;
    case paDeviceUnavailable:        result = "Device unavailable"; break;
    case paIncompatibleHostApiSpecificStreamInfo:   result = "Incompatible host API specific stream info"; break;
    case paStreamIsStopped:          result = "Stream is stopped"; break;
    case paStreamIsNotStopped:       result = "Stream is not stopped"; break;
    case paInputOverflowed:          result = "Input overflowed"; break;
    case paOutputUnderflowed:        result = "Output underflowed"; break;
    case paHostApiNotFound:          result = "Host API not found"; break;
    case paInvalidHostApi:           result = "Invalid host API"; break;
    case paCanNotReadFromACallbackStream:       result = "Can't read from a callback stream"; break;
    case paCanNotWriteToACallbackStream:        result = "Can't write to a callback stream"; break;
    case paCanNotReadFromAnOutputOnlyStream:    result = "Can't read from an output only stream"; break;
    case paCanNotWriteToAnInputOnlyStream:      result = "Can't write to an input only stream"; break;
    case paIncompatibleStreamHostApi: result = "Incompatible stream host API"; break;
    case paBadBufferPtr:             result = "Bad buffer pointer"; break;
    default:                         
		if( errorCode > 0 )
			result = "Invalid error code (value greater than zero)"; 
        else
			result = "Invalid error code"; 
        break;
    }
    return result;
}